

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu511.c
# Opt level: O1

MPP_RET vepu511_set_jpeg_reg(Vepu511JpegCfg *cfg)

{
  uint uVar1;
  int *piVar2;
  void *pvVar3;
  uint *puVar4;
  uint *puVar5;
  MppDev pvVar6;
  int iVar7;
  MppFrameFormat MVar8;
  RK_U32 offset;
  uint uVar9;
  RK_U32 RVar10;
  size_t sVar11;
  short sVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  piVar2 = (int *)cfg->jpeg_reg_base;
  pvVar3 = cfg->enc_task;
  puVar4 = *(uint **)((long)pvVar3 + 0x20);
  puVar5 = (uint *)cfg->input_fmt;
  uVar14 = *puVar4;
  uVar9 = puVar4[1];
  iVar7 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)pvVar3 + 0x68),"vepu511_set_jpeg_reg");
  piVar2[8] = iVar7;
  piVar2[9] = iVar7;
  piVar2[10] = iVar7;
  uVar13 = puVar4[3];
  if (uVar13 == 0) {
    uVar13 = puVar4[1];
  }
  uVar15 = puVar4[2];
  pvVar6 = cfg->dev;
  uVar1 = *puVar5;
  MVar8 = mpp_frame_get_fmt(*(MppFrame *)((long)pvVar3 + 0x60));
  if ((MVar8 & 0xf00000) == MPP_FMT_YUV420SP) {
    offset = uVar13 * uVar15;
    switch(uVar1) {
    case 0:
    case 1:
    case 2:
    case 8:
    case 9:
    case 10:
      RVar10 = 0;
      offset = 0;
      break;
    default:
      _mpp_log_l(2,"hal_jpege_v511","unknown color space: %d\n",(char *)0x0,(ulong)uVar1);
    case 7:
      RVar10 = offset * 5 >> 2;
      break;
    case 4:
    case 6:
    case 0xc:
      RVar10 = offset;
      break;
    case 5:
      RVar10 = offset * 3 >> 1;
      break;
    case 0xd:
      RVar10 = offset * 2;
    }
  }
  else {
    offset = mpp_frame_get_fbc_offset(*(MppFrame *)((long)pvVar3 + 0x60));
    RVar10 = offset;
  }
  if (offset != 0) {
    mpp_dev_set_reg_offset(pvVar6,0x109,offset);
  }
  if (RVar10 != 0) {
    mpp_dev_set_reg_offset(pvVar6,0x10a,RVar10);
  }
  iVar7 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)pvVar3 + 0x40),"vepu511_set_jpeg_reg");
  *piVar2 = iVar7;
  piVar2[1] = iVar7;
  piVar2[2] = iVar7;
  piVar2[3] = iVar7;
  pvVar6 = cfg->dev;
  sVar11 = mpp_packet_get_length(*(MppPacket *)((long)pvVar3 + 0x38));
  mpp_dev_set_reg_offset(pvVar6,0x102,(RK_U32)sVar11);
  pvVar6 = cfg->dev;
  sVar11 = mpp_buffer_get_size_with_caller
                     (*(MppBuffer *)((long)pvVar3 + 0x40),"vepu511_set_jpeg_reg");
  mpp_dev_set_reg_offset(pvVar6,0x100,(RK_U32)sVar11);
  uVar15 = (uVar14 + 7 >> 3) - 1 & 0x7ff;
  uVar14 = piVar2[0x10];
  piVar2[0x10] = uVar14 & 0xfffff800 | uVar15;
  uVar13 = 8 - (*puVar4 & 7);
  if ((*puVar4 & 7) == 0) {
    uVar13 = 0;
  }
  uVar13 = piVar2[0x11] & 0xffffffc0U | uVar13;
  piVar2[0x11] = uVar13;
  piVar2[0x10] = uVar14 & 0xf800f800 | uVar15 | uVar9 * 0x2000 + 0x7ffe000 & 0x7ff0000;
  uVar14 = (puVar4[1] & 7) * -0x10000 + 0x80000;
  if ((puVar4[1] & 7) == 0) {
    uVar14 = 0;
  }
  piVar2[0x11] = uVar13 & 0xffc0ffcf | uVar14;
  uVar14 = (piVar2[0x12] & 0xffffffc3U) + (*puVar5 & 0xf) * 4;
  piVar2[0x12] = uVar14;
  uVar9 = puVar5[1];
  piVar2[0x12] = uVar14 & 0xfffffffe | uVar9 & 1;
  piVar2[0x12] = (uVar14 & 0xfffff8fc | uVar9 & 1) + (puVar5[2] & 1) * 2;
  uVar9 = (uint)(0 < (int)puVar4[0xd]) << 0x1a;
  uVar14 = piVar2[0x17];
  piVar2[0x17] = uVar14 & 0xfbffffff | uVar9;
  piVar2[0x17] = uVar14 & 0xe3ffffff | uVar9 | (puVar4[0xc] & 3) << 0x1b;
  MVar8 = mpp_frame_get_fmt(*(MppFrame *)((long)pvVar3 + 0x60));
  if ((MVar8 & 0xf00000) == MPP_FMT_YUV420SP) {
    uVar14 = puVar4[2];
    if (puVar4[2] == 0) {
      uVar9 = (uint)piVar2[0x12] >> 2 & 0xf;
      uVar14 = 0;
      if (uVar9 < 0xe) {
        if ((0x304U >> uVar9 & 1) == 0) {
          if ((0x3002U >> uVar9 & 1) == 0) {
            uVar14 = 0;
            if (uVar9 == 0) {
              uVar14 = *puVar4 << 2;
            }
          }
          else {
            uVar14 = *puVar4 * 3;
          }
        }
        else {
          uVar14 = *puVar4 * 2;
        }
      }
    }
  }
  else {
    *(byte *)((long)piVar2 + 0x5f) = *(byte *)((long)piVar2 + 0x5f) | 0x40;
    uVar14 = mpp_frame_get_fbc_hdr_stride(*(MppFrame *)((long)pvVar3 + 0x60));
    if (uVar14 == 0) {
      uVar14 = puVar4[2] + 0xf >> 2 & 0xfffffffc;
    }
  }
  uVar9 = (uint)piVar2[0x12] >> 2 & 0xf;
  if ((0xd < uVar9) || (uVar13 = uVar14, (0x2050U >> uVar9 & 1) == 0)) {
    uVar13 = (int)uVar14 / 2;
  }
  uVar9 = piVar2[0x12] & 0x3c;
  if (uVar9 < 0xc) {
    piVar2[0x13] = piVar2[0x13] & 0xf8000000U | 0x1090219;
    piVar2[0x14] = piVar2[0x14] & 0xf8000000U | 0x76b6c70;
    piVar2[0x15] = piVar2[0x15] & 0xf8000000U | 0x1c345ee;
    piVar2[0x16] = piVar2[0x16] & 0xffe00000U | 0x108080;
  }
  piVar2[0x19] = piVar2[0x19] & 0xffe00000U | uVar14 & 0x1fffff;
  sVar12 = (short)uVar13;
  if (uVar9 == 0x30) {
    sVar12 = (short)uVar14 * 2;
  }
  *(short *)(piVar2 + 0x1a) = sVar12;
  RVar10 = mpp_frame_get_offset_y(*(MppFrame *)((long)pvVar3 + 0x60));
  piVar2[0x18] = piVar2[0x18] & 0xc000ffffU | (RVar10 & 0x3fff) << 0x10;
  RVar10 = mpp_frame_get_offset_x(*(MppFrame *)((long)pvVar3 + 0x60));
  piVar2[0x18] = piVar2[0x18] & 0xffffc000U | RVar10 & 0x3fff;
  piVar2[0x1c] = piVar2[0x1c] & 0xffff8000;
  piVar2[0x1d] = piVar2[0x1d] & 0xffff8000;
  piVar2[0x1e] = piVar2[0x1e] & 0xffff8000;
  piVar2[0x1f] = (puVar4[0x28] & 0x1ffffff) + (piVar2[0x1f] & 0x40000000U) + -0x60000000;
  piVar2[0x20] = piVar2[0x20] & 0xc0000000;
  return MPP_OK;
}

Assistant:

MPP_RET vepu511_set_jpeg_reg(Vepu511JpegCfg *cfg)
{
    HalEncTask *task = ( HalEncTask *)cfg->enc_task;
    JpegeSyntax *syn = (JpegeSyntax *)task->syntax.data;
    Vepu511JpegReg *regs = (Vepu511JpegReg *)cfg->jpeg_reg_base;
    VepuFmtCfg *fmt = (VepuFmtCfg *)cfg->input_fmt;
    RK_U32 pic_width_align8, pic_height_align8;
    RK_S32 stridey = 0;
    RK_S32 stridec = 0;

    pic_width_align8 = (syn->width + 7) & (~7);
    pic_height_align8 = (syn->height + 7) & (~7);

    regs->adr_src0 =  mpp_buffer_get_fd(task->input);
    regs->adr_src1 = regs->adr_src0;
    regs->adr_src2 = regs->adr_src0;

    vepu511_jpeg_set_patch_info(cfg->dev, syn, (Vepu541Fmt) fmt->format, task);

    regs->adr_bsbt = mpp_buffer_get_fd(task->output);
    regs->adr_bsbb = regs->adr_bsbt;
    regs->adr_bsbs = regs->adr_bsbt;
    regs->adr_bsbr = regs->adr_bsbt;

    mpp_dev_set_reg_offset(cfg->dev, 258, mpp_packet_get_length(task->packet));
    mpp_dev_set_reg_offset(cfg->dev, 256, mpp_buffer_get_size(task->output));

    regs->enc_rsl.pic_wd8_m1    = pic_width_align8 / 8 - 1;
    regs->src_fill.pic_wfill    = (syn->width & 0x7)
                                  ? (8 - (syn->width & 0x7)) : 0;
    regs->enc_rsl.pic_hd8_m1    = pic_height_align8 / 8 - 1;
    regs->src_fill.pic_hfill    = (syn->height & 0x7)
                                  ? (8 - (syn->height & 0x7)) : 0;

    regs->src_fmt.src_cfmt = fmt->format;
    regs->src_fmt.alpha_swap = fmt->alpha_swap;
    regs->src_fmt.rbuv_swap  = fmt->rbuv_swap;
    regs->src_fmt.src_range_trns_en  = 0;
    regs->src_fmt.src_range_trns_sel = 0;
    regs->src_fmt.chroma_ds_mode     = 0;
    regs->src_proc.src_mirr = syn->mirroring > 0;
    regs->src_proc.src_rot = syn->rotation;

    if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(task->frame))) {
        regs->src_proc.rkfbcd_en = 1;

        stridey = mpp_frame_get_fbc_hdr_stride(task->frame);
        if (!stridey)
            stridey = MPP_ALIGN(syn->hor_stride, 16) >> 2;
    } else if (syn->hor_stride) {
        stridey = syn->hor_stride;
    } else {
        if (regs->src_fmt.src_cfmt == VEPU541_FMT_BGRA8888 )
            stridey = syn->width * 4;
        else if (regs->src_fmt.src_cfmt == VEPU541_FMT_BGR888 ||
                 regs->src_fmt.src_cfmt == VEPU580_FMT_YUV444P ||
                 regs->src_fmt.src_cfmt == VEPU580_FMT_YUV444SP)
            stridey = syn->width * 3;
        else if (regs->src_fmt.src_cfmt == VEPU541_FMT_BGR565 ||
                 regs->src_fmt.src_cfmt == VEPU541_FMT_YUYV422 ||
                 regs->src_fmt.src_cfmt == VEPU541_FMT_UYVY422)
            stridey = syn->width * 2;
    }

    stridec = (regs->src_fmt.src_cfmt == VEPU541_FMT_YUV422SP ||
               regs->src_fmt.src_cfmt == VEPU541_FMT_YUV420SP ||
               regs->src_fmt.src_cfmt == VEPU580_FMT_YUV444P) ?
              stridey : stridey / 2;

    if (regs->src_fmt.src_cfmt == VEPU580_FMT_YUV444SP)
        stridec = stridey * 2;

    if (regs->src_fmt.src_cfmt < VEPU541_FMT_NONE) {
        regs->src_udfy.csc_wgt_r2y = 66;
        regs->src_udfy.csc_wgt_g2y = 129;
        regs->src_udfy.csc_wgt_b2y = 25;

        regs->src_udfu.csc_wgt_r2u = -38;
        regs->src_udfu.csc_wgt_g2u = -74;
        regs->src_udfu.csc_wgt_b2u = 112;

        regs->src_udfv.csc_wgt_r2v = 112;
        regs->src_udfv.csc_wgt_g2v = -94;
        regs->src_udfv.csc_wgt_b2v = -18;

        regs->src_udfo.csc_ofst_y = 16;
        regs->src_udfo.csc_ofst_u = 128;
        regs->src_udfo.csc_ofst_v = 128;
    }

    regs->src_strd0.src_strd0  = stridey;
    regs->src_strd1.src_strd1  = stridec;
    regs->pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    regs->y_cfg.bias_y = 0;
    regs->u_cfg.bias_u = 0;
    regs->v_cfg.bias_v = 0;

    regs->base_cfg.ri  = syn->restart_ri;
    regs->base_cfg.out_mode = 0;
    regs->base_cfg.start_rst_m = 0;
    regs->base_cfg.pic_last_ecs = 1;
    regs->base_cfg.stnd = 1;

    regs->uvc_cfg.uvc_partition0_len = 0;
    regs->uvc_cfg.uvc_partition_len = 0;
    regs->uvc_cfg.uvc_skip_len = 0;
    return MPP_OK;
}